

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

int __thiscall mkvparser::Track::Info::CopyStr(Info *this,offset_in_Info_to_unknown str,Info *dst_)

{
  long *num_elements;
  size_t __n;
  char *pcVar1;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  size_t len;
  char *src;
  char **dst;
  char *__s;
  undefined4 local_4;
  
  if (in_RSI == -1) {
    local_4 = -1;
  }
  else {
    num_elements = (long *)(in_RDX + in_RSI);
    if (*num_elements == 0) {
      __s = *(char **)(in_RDI + in_RSI);
      if (__s == (char *)0x0) {
        local_4 = 0;
      }
      else {
        __n = strlen(__s);
        pcVar1 = SafeArrayAlloc<char>((unsigned_long_long)num_elements,(unsigned_long_long)__s);
        *num_elements = (long)pcVar1;
        if (*num_elements == 0) {
          local_4 = -1;
        }
        else {
          memcpy((void *)*num_elements,__s,__n);
          *(undefined1 *)(*num_elements + __n) = 0;
          local_4 = 0;
        }
      }
    }
    else {
      local_4 = -1;
    }
  }
  return local_4;
}

Assistant:

int Track::Info::CopyStr(char* Info::*str, Info& dst_) const {
  if (str == static_cast<char * Info::*>(NULL))
    return -1;

  char*& dst = dst_.*str;

  if (dst)  // should be NULL already
    return -1;

  const char* const src = this->*str;

  if (src == NULL)
    return 0;

  const size_t len = strlen(src);

  dst = SafeArrayAlloc<char>(1, len + 1);

  if (dst == NULL)
    return -1;

  memcpy(dst, src, len);
  dst[len] = '\0';

  return 0;
}